

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseFactor(StructuralParser *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  Handle h;
  Expression *pEVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  char *v;
  Value *this_00;
  complex<double> v_00;
  string_view text;
  pool_ptr<soul::AST::Expression> type;
  undefined1 local_258 [72];
  Value local_210;
  Value local_1d0;
  Value local_190;
  Value local_150;
  Value local_110;
  Value local_d0;
  Value local_90;
  Value local_50;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
  if (bVar1) {
    pEVar3 = parseParenthesisedExpression(this);
    return pEVar3;
  }
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 != "$integer32") {
    if (__s1 == (char *)0x0) {
LAB_001d53ef:
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27bb0c);
      if (!bVar1) {
        tryParsingType((StructuralParser *)local_258,(ParseTypeContext)this);
        if ((QualifiedIdentifier *)local_258._0_8_ == (QualifiedIdentifier *)0x0) {
          local_258._0_8_ = parseQualifiedIdentifier(this);
        }
        pEVar3 = parseSuffixes(this,(Expression *)local_258._0_8_);
        return pEVar3;
      }
      pEVar3 = &parseProcessorProperty(this)->super_Expression;
      return pEVar3;
    }
    iVar2 = strcmp(__s1,"$integer32");
    if (iVar2 != 0) {
      if ((__s1 == "$integer64") || (iVar2 = strcmp(__s1,"$integer64"), iVar2 == 0)) {
        soul::Value::Value(&local_90,(this->super_SOULTokeniser).literalIntValue);
        pEVar3 = createLiteral(this,&local_90);
        this_00 = &local_90;
      }
      else if ((__s1 == "$float64") || (iVar2 = strcmp(__s1,"$float64"), iVar2 == 0)) {
        soul::Value::Value(&local_d0,(this->super_SOULTokeniser).literalDoubleValue);
        pEVar3 = createLiteral(this,&local_d0);
        this_00 = &local_d0;
      }
      else {
        if (__s1 != "$float32") {
          v = "$float32";
          iVar2 = strcmp(__s1,"$float32");
          if (iVar2 != 0) {
            if (__s1 != "$imag32") {
              v = "$imag32";
              iVar2 = strcmp(__s1,"$imag32");
              if (iVar2 != 0) {
                uVar4 = extraout_RDX;
                if (__s1 != "$imag64") {
                  v = "$imag64";
                  iVar2 = strcmp(__s1,"$imag64");
                  uVar4 = extraout_RDX_00;
                  if (iVar2 != 0) {
                    if ((__s1 == "$string literal") ||
                       (iVar2 = strcmp(__s1,"$string literal"), iVar2 == 0)) {
                      text._M_str = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
                      text._M_len = (this->super_SOULTokeniser).currentStringValue._M_string_length;
                      h = StringDictionary::getHandleForString
                                    (&this->allocator->stringDictionary,text);
                      soul::Value::createStringLiteral(&local_1d0,h);
                      pEVar3 = createLiteral(this,&local_1d0);
                      this_00 = &local_1d0;
                    }
                    else if ((__s1 == "true") || (iVar2 = strcmp(__s1,"true"), iVar2 == 0)) {
                      soul::Value::Value(&local_210,true);
                      pEVar3 = createLiteral(this,&local_210);
                      this_00 = &local_210;
                    }
                    else {
                      if ((__s1 != "false") && (iVar2 = strcmp(__s1,"false"), iVar2 != 0))
                      goto LAB_001d53ef;
                      soul::Value::Value((Value *)(local_258 + 8),false);
                      pEVar3 = createLiteral(this,(Value *)(local_258 + 8));
                      this_00 = (Value *)(local_258 + 8);
                    }
                    goto LAB_001d5602;
                  }
                }
                v_00._M_value._8_8_ = uVar4;
                v_00._M_value._0_8_ = v;
                soul::Value::Value(&local_190,v_00);
                pEVar3 = createLiteral(this,&local_190);
                this_00 = &local_190;
                goto LAB_001d5602;
              }
            }
            soul::Value::Value(&local_150,(complex<float>)v);
            pEVar3 = createLiteral(this,&local_150);
            this_00 = &local_150;
            goto LAB_001d5602;
          }
        }
        soul::Value::Value(&local_110,(float)(this->super_SOULTokeniser).literalDoubleValue);
        pEVar3 = createLiteral(this,&local_110);
        this_00 = &local_110;
      }
      goto LAB_001d5602;
    }
  }
  soul::Value::Value(&local_50,(int32_t)(this->super_SOULTokeniser).literalIntValue);
  pEVar3 = createLiteral(this,&local_50);
  this_00 = &local_50;
LAB_001d5602:
  soul::Value::~Value(this_00);
  return pEVar3;
}

Assistant:

AST::Expression& parseFactor()
    {
        if (matchIf (Operator::openParen))     return parseParenthesisedExpression();
        if (matches (Token::literalInt32))     return createLiteral (Value::createInt32 (literalIntValue));
        if (matches (Token::literalInt64))     return createLiteral (Value::createInt64 (literalIntValue));
        if (matches (Token::literalFloat64))   return createLiteral (Value (literalDoubleValue));
        if (matches (Token::literalFloat32))   return createLiteral (Value (static_cast<float> (literalDoubleValue)));
        if (matches (Token::literalImag32))    return createLiteral (Value (std::complex (0.0f, static_cast<float> (literalDoubleValue))));
        if (matches (Token::literalImag64))    return createLiteral (Value (std::complex (0.0, static_cast<double> (literalDoubleValue))));
        if (matches (Token::literalString))    return createLiteral (Value::createStringLiteral (allocator.stringDictionary.getHandleForString (currentStringValue)));
        if (matches (Keyword::true_))          return createLiteral (Value (true));
        if (matches (Keyword::false_))         return createLiteral (Value (false));
        if (matchIf (Keyword::processor))      return parseProcessorProperty();

        if (auto type = tryParsingType (ParseTypeContext::nameOrType))
            return parseSuffixes (*type);

        return parseSuffixes (parseQualifiedIdentifier());
    }